

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractslider.cpp
# Opt level: O0

void __thiscall
QAbstractSlider::setRepeatAction
          (QAbstractSlider *this,SliderAction action,int thresholdTime,int repeatTime)

{
  QAbstractSliderPrivate *pQVar1;
  int in_ECX;
  undefined4 in_EDX;
  SliderAction in_ESI;
  QAbstractSliderPrivate *d;
  undefined4 in_stack_ffffffffffffffe8;
  
  pQVar1 = d_func((QAbstractSlider *)0x50db87);
  pQVar1->repeatAction = in_ESI;
  if (in_ESI == SliderNoAction) {
    QBasicTimer::stop();
  }
  else {
    pQVar1->repeatActionTime = in_ECX;
    QBasicTimer::start((QBasicTimer *)CONCAT44(in_ESI,in_EDX),d._4_4_,
                       (QObject *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

void QAbstractSlider::setRepeatAction(SliderAction action, int thresholdTime, int repeatTime)
{
    Q_D(QAbstractSlider);
    if ((d->repeatAction = action) == SliderNoAction) {
        d->repeatActionTimer.stop();
    } else {
        d->repeatActionTime = repeatTime;
        d->repeatActionTimer.start(thresholdTime, this);
    }
}